

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observer.cpp
# Opt level: O2

void __thiscall Person::set_age(Person *this,size_t age)

{
  allocator<char> local_49;
  any local_48;
  string local_38;
  
  std::recursive_mutex::lock(&this->m_mtx);
  if (this->m_age != age) {
    this->m_age = age;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"age",&local_49);
    local_48._M_manager = std::any::_Manager_internal<unsigned_long>::_S_manage;
    local_48._M_storage = (_Storage)age;
    notify(this,&local_38,&local_48);
    std::any::reset(&local_48);
    std::__cxx11::string::~string((string *)&local_38);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_mtx);
  return;
}

Assistant:

void set_age(size_t age)
	{
		std::lock_guard<decltype(m_mtx)> lock(m_mtx);

		if(age != m_age)
		{
			m_age = age;
			notify("age", age);
		}
	}